

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O3

void hwnet::ThreadPool::threadFunc(TaskQueue *queue_)

{
  undefined8 *puVar1;
  undefined8 *local_30;
  Ptr task;
  
  do {
    TaskQueue::Get((TaskQueue *)&local_30);
    puVar1 = local_30;
    if (local_30 != (undefined8 *)0x0) {
      (**(code **)*local_30)(local_30);
    }
    if (task.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 task.super___shared_ptr<hwnet::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  } while (puVar1 != (undefined8 *)0x0);
  return;
}

Assistant:

void ThreadPool::threadFunc(ThreadPool::TaskQueue *queue_) {
	for(;;) {
		Task::Ptr task = queue_->Get();
		if(task == nullptr) {
			return;
		}
		task->Do();
	}
}